

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::setToolTip(QGraphicsItem *this,QString *toolTip)

{
  QList<QGraphicsItemPrivate::ExtraStruct> *this_00;
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  int iVar3;
  pointer pEVar4;
  long lVar5;
  ExtraStruct *pEVar6;
  long in_FS_OFFSET;
  QArrayData *local_d0 [3];
  QVariant local_b8;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  undefined1 local_50 [40];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)local_50,(QString *)toolTip);
  (*this->_vptr_QGraphicsItem[0x21])(&local_78,this,0x13,(QVariant *)local_50);
  ::QVariant::~QVariant((QVariant *)local_50);
  pQVar1 = (this->d_ptr).d;
  ::QVariant::toString();
  ::QVariant::QVariant(&local_98,(QString *)local_d0);
  lVar2 = (pQVar1->extras).d.size;
  iVar3 = -1;
  if (lVar2 != 0) {
    pEVar6 = (pQVar1->extras).d.ptr;
    lVar5 = 0;
    do {
      if (pEVar6->type == ExtraToolTip) {
        iVar3 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
      pEVar6 = pEVar6 + 1;
    } while (lVar2 != lVar5);
  }
  this_00 = &pQVar1->extras;
  if (iVar3 == -1) {
    local_50._0_4_ = 0;
    ::QVariant::QVariant((QVariant *)(local_50 + 8),&local_98);
    QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::
    emplace<QGraphicsItemPrivate::ExtraStruct>
              ((QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *)this_00,
               (pQVar1->extras).d.size,(ExtraStruct *)local_50);
    QList<QGraphicsItemPrivate::ExtraStruct>::end(this_00);
    ::QVariant::~QVariant((QVariant *)(local_50 + 8));
  }
  else {
    pEVar4 = QList<QGraphicsItemPrivate::ExtraStruct>::data(this_00);
    ::QVariant::operator=(&pEVar4[iVar3].value,&local_98);
  }
  ::QVariant::~QVariant(&local_98);
  if (local_d0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d0[0],2,0x10);
    }
  }
  (*this->_vptr_QGraphicsItem[0x21])(&local_b8,this,0x14,&local_78);
  ::QVariant::~QVariant(&local_b8);
  ::QVariant::~QVariant((QVariant *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setToolTip(const QString &toolTip)
{
    const QVariant toolTipVariant(itemChange(ItemToolTipChange, toolTip));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraToolTip, toolTipVariant.toString());
    itemChange(ItemToolTipHasChanged, toolTipVariant);
}